

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_> *
Utils::fillItemIdList
          (vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
           *__return_storage_ptr__,int count,const_iterator it)

{
  pointer *this;
  int iVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_100;
  uchar *local_f8;
  uint *local_f0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  int local_9c;
  iterator iStack_98;
  int itemIDSize;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  uchar *local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  undefined1 local_50 [8];
  ItemIDList itemIdList;
  const_iterator cStack_18;
  int count_local;
  const_iterator it_local;
  vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_> *IDList;
  
  itemIdList.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  itemIdList.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = count;
  cStack_18._M_current = it._M_current;
  it_local._M_current = (uchar *)__return_storage_ptr__;
  std::vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>::vector
            (__return_storage_ptr__);
  while (0 < itemIdList.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage._4_4_) {
    LinkTargetIDList::ItemIDList::ItemIDList((ItemIDList *)local_50);
    local_58._M_current = cStack_18._M_current;
    local_60 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&stack0xffffffffffffffe8,2);
    local_68 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    local_80 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::
               copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                         (local_58,local_60,
                          (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           )local_68);
    local_88 = (uchar *)__gnu_cxx::
                        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&stack0xffffffffffffffe8,2);
    cStack_18._M_current = local_88;
    local_90._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    iStack_98 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (local_90,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         )iStack_98._M_current);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_b8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    iVar1 = lenTwoBytes(&local_b8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b8);
    local_c0._M_current = cStack_18._M_current;
    local_9c = iVar1;
    local_d0 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&stack0xffffffffffffffe8,(long)iVar1);
    local_c8 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator-(&local_d0,2);
    local_d8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &itemIdList.ItemIDSize.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    local_e0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::
               copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                         (local_c0,local_c8,
                          (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           )local_d8);
    this = &itemIdList.ItemIDSize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    local_f0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (local_e8,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         )local_f0);
    local_100 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&stack0xffffffffffffffe8,(long)local_9c);
    local_f8 = (uchar *)__gnu_cxx::
                        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator-(&local_100,2);
    cStack_18._M_current = local_f8;
    std::vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>::
    push_back(__return_storage_ptr__,(value_type *)local_50);
    itemIdList.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         itemIdList.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ - local_9c;
    LinkTargetIDList::ItemIDList::~ItemIDList((ItemIDList *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<LinkTargetIDList::ItemIDList> Utils::fillItemIdList(int count, std::vector<unsigned char>::const_iterator it) {
    std::vector<LinkTargetIDList::ItemIDList> IDList;
    while (count > 0) {
        LinkTargetIDList::ItemIDList itemIdList;
        copy(it, it + 2, std::back_inserter(itemIdList.ItemIDSize));          // 2 byte
        it = it + 2;
        reverse(itemIdList.ItemIDSize.begin(), itemIdList.ItemIDSize.end());
        int itemIDSize = Utils::lenTwoBytes(itemIdList.ItemIDSize);

        copy(it, it + itemIDSize - 2, std::back_inserter(itemIdList.Data));       // itemIDSize byte
        reverse(itemIdList.Data.begin(), itemIdList.Data.end());
        it = it + itemIDSize - 2;

        IDList.push_back(itemIdList);
        count = count - itemIDSize;
    }
    return IDList;
}